

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiterTests.cpp
# Opt level: O3

void __thiscall
solitaire::ChronoFPSLimiterTests_sleepRestOfFrameTimeSavedDuringConstruction_Test::TestBody
          (ChronoFPSLimiterTests_sleepRestOfFrameTimeSavedDuringConstruction_Test *this)

{
  _Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false> local_40;
  undefined1 local_38 [8];
  ChronoFPSLimiter local_30;
  
  ChronoFPSLimiterTests::expectGetActualTime(&this->super_ChronoFPSLimiterTests,3);
  mock_ptr<solitaire::time::StdTimeFunctionsWrapperMock>::make_unique
            ((mock_ptr<solitaire::time::StdTimeFunctionsWrapperMock> *)local_38);
  local_40._M_head_impl = (StdTimeFunctionsWrapper *)local_38;
  local_38 = (undefined1  [8])0x0;
  time::ChronoFPSLimiter::ChronoFPSLimiter
            (&local_30,0x3c,
             (unique_ptr<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
              *)&local_40);
  if ((StdTimeFunctionsWrapperMock *)local_40._M_head_impl != (StdTimeFunctionsWrapperMock *)0x0) {
    (*((StdTimeFunctionsWrapper *)&(local_40._M_head_impl)->_vptr_StdTimeFunctionsWrapper)->
      _vptr_StdTimeFunctionsWrapper[1])();
  }
  local_40._M_head_impl = (StdTimeFunctionsWrapper *)0x0;
  if (local_38 != (undefined1  [8])0x0) {
    (*((StdTimeFunctionsWrapper *)local_38)->_vptr_StdTimeFunctionsWrapper[1])();
  }
  ChronoFPSLimiterTests::expectGetActualTime(&this->super_ChronoFPSLimiterTests,5);
  ChronoFPSLimiterTests::expectSleepForCalculatedRestOfTime(&this->super_ChronoFPSLimiterTests,3,5);
  time::ChronoFPSLimiter::sleepRestOfFrameTime(&local_30);
  local_30.super_FPSLimiter._vptr_FPSLimiter = (_func_int **)&PTR__ChronoFPSLimiter_0032dbc0;
  if ((_Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
       )local_30.stdTimeFunctionsWrapper._M_t.
        super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
        .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>.
        _M_head_impl != (StdTimeFunctionsWrapper *)0x0) {
    (*(*(_func_int ***)
        local_30.stdTimeFunctionsWrapper._M_t.
        super___uniq_ptr_impl<solitaire::time::interfaces::StdTimeFunctionsWrapper,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_std::default_delete<solitaire::time::interfaces::StdTimeFunctionsWrapper>_>
        .super__Head_base<0UL,_solitaire::time::interfaces::StdTimeFunctionsWrapper_*,_false>.
        _M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_F(ChronoFPSLimiterTests, sleepRestOfFrameTimeSavedDuringConstruction) {
    constexpr Milliseconds stop {5};

    expectGetActualTime(start);
    ChronoFPSLimiter fpsLimiter {fps, stdTimeFunctionsWrapperMock.make_unique()};

    expectGetActualTime(stop);
    expectSleepForCalculatedRestOfTime(start, stop);
    fpsLimiter.sleepRestOfFrameTime();
}